

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

void Of_ManPrintCuts(Of_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  int *piVar5;
  bool bVar6;
  uint local_78;
  int Shift;
  int nCutsAll;
  int nAndsAll;
  Vec_Int_t *vBestCut;
  Vec_Int_t *vBestNode;
  Vec_Int_t *vCutNum;
  Vec_Int_t *vFirst;
  int nCuts;
  int Var;
  int v;
  int k;
  int i;
  int *pCutBest;
  int *pCut;
  int *pCutSet;
  Gia_Obj_t *pObj;
  int fVerbose;
  Of_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p->pGia);
  p_00 = Vec_IntStartFull(iVar1);
  iVar1 = Gia_ManObjNum(p->pGia);
  p_01 = Vec_IntStartFull(iVar1);
  p_02 = Vec_IntAlloc(100);
  p_03 = Vec_IntAlloc(100);
  Shift = 0;
  local_78 = 0;
  iVar1 = Gia_ManAndNum(p->pGia);
  Gia_ManFillValue(p->pGia);
  v = 0;
  while( true ) {
    bVar6 = false;
    if (v < p->pGia->nObjs) {
      pCutSet = (int *)Gia_ManObj(p->pGia,v);
      bVar6 = (Gia_Obj_t *)pCutSet != (Gia_Obj_t *)0x0;
    }
    if (!bVar6) break;
    iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)pCutSet);
    if (iVar2 != 0) {
      _k = (int *)0x0;
      iVar2 = Of_ObjRefNum(p,v);
      if (iVar2 != 0) {
        Vec_IntPush(p_02,Shift);
        _k = Of_ObjCutBestP(p,v);
      }
      iVar2 = Shift + 1;
      pCutSet[2] = Shift;
      piVar5 = Of_ObjCutSet(p,v);
      vFirst._4_4_ = 0;
      Var = 0;
      pCutBest = piVar5 + 1;
      while (Var < *piVar5) {
        vFirst._4_4_ = vFirst._4_4_ + 1;
        Var = Var + 1;
        iVar3 = Of_CutSize(pCutBest);
        pCutBest = pCutBest + (iVar3 + 4);
      }
      Vec_IntWriteEntry(p_00,v,iVar1 + local_78);
      Vec_IntWriteEntry(p_01,v,vFirst._4_4_);
      Var = 0;
      pCutBest = piVar5 + 1;
      while (Shift = iVar2, Var < *piVar5) {
        if (_k == pCutBest) {
          Vec_IntPush(p_03,iVar1 + local_78);
        }
        local_78 = local_78 + 1;
        Var = Var + 1;
        iVar3 = Of_CutSize(pCutBest);
        pCutBest = pCutBest + (iVar3 + 4);
      }
    }
    v = v + 1;
  }
  if (Shift != iVar1) {
    __assert_fail("nAndsAll == Shift",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaOf.c"
                  ,0x68b,"void Of_ManPrintCuts(Of_Man_t *)");
  }
  uVar4 = Vec_IntSize(p_02);
  printf("Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n",(ulong)(uint)Shift,(ulong)uVar4,
         (ulong)local_78);
  Of_ManCreateSat(p,local_78,p_00,p_01,p_02,p_03);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  return;
}

Assistant:

void Of_ManPrintCuts( Of_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    int * pCutSet, * pCut, * pCutBest;
    int i, k, v, Var, nCuts;
    Vec_Int_t * vFirst  = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vCutNum = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vBestNode = Vec_IntAlloc( 100 );
    Vec_Int_t * vBestCut  = Vec_IntAlloc( 100 );
    int nAndsAll = 0, nCutsAll = 0, Shift = Gia_ManAndNum(p->pGia);
    Gia_ManFillValue( p->pGia );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        // get the best cut
        pCutBest = NULL;
        if ( Of_ObjRefNum(p, i) )
        {
            Vec_IntPush( vBestNode, nAndsAll );
            pCutBest = Of_ObjCutBestP( p, i ); 
        }
        pObj->Value = nAndsAll++;
        // get the cutset
        pCutSet = Of_ObjCutSet(p, i);
        // count cuts
        nCuts = 0;
        Of_SetForEachCut( pCutSet, pCut, k )
            nCuts++;
        // save
        Vec_IntWriteEntry( vFirst,  i, Shift + nCutsAll );
        Vec_IntWriteEntry( vCutNum, i, nCuts );
        // print cuts
        if ( fVerbose )
            printf( "Node %d. Cuts %d.\n", i, nCuts );
        Of_SetForEachCut( pCutSet, pCut, k )
        {
            if ( fVerbose )
            {
                printf( "{ " );
                Of_CutForEachVar( pCut, Var, v )
                    printf( "%d ", Var );
                printf( "} %s\n", pCutBest == pCut ? "best" :"" );
            }
            if ( pCutBest == pCut )
                Vec_IntPush( vBestCut, Shift + nCutsAll );
            nCutsAll++;
        }
    }
    assert( nAndsAll == Shift );
    printf( "Total:   Ands = %d.  Luts = %d.  Cuts = %d.\n", nAndsAll, Vec_IntSize(vBestNode), nCutsAll );

    // create SAT problem
    Of_ManCreateSat( p, nCutsAll, vFirst, vCutNum, vBestNode, vBestCut );

    Vec_IntFree( vFirst );
    Vec_IntFree( vCutNum );
    Vec_IntFree( vBestNode );
    Vec_IntFree( vBestCut );
}